

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
VFS::CVFS::Serialize(vector<char,_std::allocator<char>_> *__return_storage_ptr__,CVFS *this)

{
  mutex *__mutex;
  pthread_mutex_t *__mutex_00;
  CVFSNode *Node;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type __new_size;
  size_t Size;
  _Alloc_hider file;
  int iVar1;
  CVFSFile *this_01;
  long *plVar2;
  CVFSException *this_02;
  char *pcVar3;
  long lVar4;
  _Alloc_hider _Var5;
  undefined1 auVar6 [12];
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> Childs;
  VFSFile Disk;
  uint64_t Entries;
  char local_79;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  this_01 = (CVFSFile *)operator_new(0x90);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"stream","");
  CVFSFile::CVFSFile(this_01,&local_78);
  local_58._M_dataplus._M_p = (pointer)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VFS::CVFS::CVFSFile*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  CVFSFile::Clear((CVFSFile *)local_58._M_dataplus._M_p);
  CVFSFile::Write((CVFSFile *)local_58._M_dataplus._M_p,(this->MAGIC)._M_dataplus._M_p,
                  (this->MAGIC)._M_string_length);
  CVFSDir::GetChilds((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                      *)&local_78,
                     (this->m_Root).
                     super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  lVar4 = local_78._M_string_length - (long)local_78._M_dataplus._M_p;
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  ~vector((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           *)&local_78);
  local_38 = lVar4 >> 4;
  CVFSFile::Write((CVFSFile *)local_58._M_dataplus._M_p,(char *)&local_38,8);
  _Var5._M_p = local_58._M_dataplus._M_p;
  lVar4 = (long)this->DISK_CHUNK_SIZE - ((this->MAGIC)._M_string_length + 8);
  if (lVar4 != 0) {
    do {
      local_79 = '\0';
      CVFSFile::Write((CVFSFile *)_Var5._M_p,&local_79,1);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  CVFSDir::GetChilds((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                      *)&local_78,
                     (this->m_Root).
                     super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  file._M_p = local_58._M_dataplus._M_p;
  for (_Var5._M_p = local_78._M_dataplus._M_p; local_58._M_dataplus._M_p = file._M_p,
      _Var5._M_p != (pointer)local_78._M_string_length; _Var5._M_p = _Var5._M_p + 0x10) {
    Node = *(CVFSNode **)_Var5._M_p;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)_Var5._M_p + 8);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    SerializeNode(this,(CVFSFile *)file._M_p,Node);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    file._M_p = local_58._M_dataplus._M_p;
  }
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &(((CVFSFile *)file._M_p)->super_CVFSNode).m_UpdateLock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    __new_size = ((CVFSFile *)file._M_p)->m_Size;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::vector<char,_std::allocator<char>_>::resize(__return_storage_ptr__,__new_size);
    _Var5._M_p = local_58._M_dataplus._M_p;
    pcVar3 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __mutex_00 = (pthread_mutex_t *)(local_58._M_dataplus._M_p + 0x40);
    iVar1 = pthread_mutex_lock(__mutex_00);
    if (iVar1 == 0) {
      Size = *(size_t *)(_Var5._M_p + 0x70);
      pthread_mutex_unlock(__mutex_00);
      CVFSFile::Read((CVFSFile *)_Var5._M_p,pcVar3,Size,0);
      std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
      ::~vector((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                 *)&local_78);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      return __return_storage_ptr__;
    }
  }
  auVar6 = std::__throw_system_error(iVar1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
  }
  if (auVar6._8_4_ == 1) {
    plVar2 = (long *)__cxa_begin_catch(auVar6._0_8_);
    this_02 = (CVFSException *)__cxa_allocate_exception(0x30);
    pcVar3 = (char *)(**(code **)(*plVar2 + 0x10))(plVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,pcVar3,(allocator<char> *)&local_38);
    std::operator+(&local_78,"Can\'t create stream. Out of mem. bad_alloc: ",&local_58);
    CVFSException::CVFSException(this_02,&local_78,OUT_OF_MEM);
    __cxa_throw(this_02,&CVFSException::typeinfo,CVFSException::~CVFSException);
  }
  _Unwind_Resume(auVar6._0_8_);
}

Assistant:

std::vector<char> Serialize()
            {
                try
                {
                    VFSFile Disk = VFSFile(new CVFSFile("stream"));
                    Disk->Clear();
                    Disk->Write(MAGIC.data(), MAGIC.size());

                    uint64_t Entries = m_Root->GetChilds().size();
                    Disk->Write((char*)&Entries, sizeof(Entries));
                    FillSpace(Disk.get(), DISK_CHUNK_SIZE - (MAGIC.size() + sizeof(Entries)));

                    auto Childs = m_Root->GetChilds();
                    for (auto e : Childs)
                        SerializeNode(Disk.get(), e.get());

                    std::vector<char> Ret;
                    Ret.resize(Disk->Size());
                    Disk->Read(&Ret[0], Disk->Size(), 0);
                    return Ret;
                }
                catch(const std::bad_alloc &e)
                {
                    throw CVFSException("Can't create stream. Out of mem. bad_alloc: " + std::string(e.what()), VFSError::OUT_OF_MEM);
                }
            }